

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_savedeclarationsto(_glist *x,_binbuf *b)

{
  int iVar1;
  t_symbol *ptVar2;
  _glist *p_Var3;
  _glist *local_20;
  t_gobj *y;
  _binbuf *b_local;
  _glist *x_local;
  
  for (local_20 = (_glist *)x->gl_list; local_20 != (_glist *)0x0;
      local_20 = (_glist *)(local_20->gl_obj).te_g.g_next) {
    if ((local_20->gl_obj).te_g.g_pd == declare_class) {
      ptVar2 = gensym("#X");
      binbuf_addv(b,"s",ptVar2);
      binbuf_addbinbuf(b,(local_20->gl_obj).te_binbuf);
      binbuf_addv(b,";");
    }
    else {
      p_Var3 = pd_checkglist((t_pd *)local_20);
      if ((p_Var3 != (_glist *)0x0) &&
         ((pd_compatibilitylevel < 0x2f || (iVar1 = canvas_isabstraction(local_20), iVar1 == 0)))) {
        canvas_savedeclarationsto(local_20,b);
      }
    }
  }
  return;
}

Assistant:

void canvas_savedeclarationsto(t_canvas *x, t_binbuf *b)
{
    t_gobj *y;

    for (y = x->gl_list; y; y = y->g_next)
    {
        if (pd_class(&y->g_pd) == declare_class)
        {
            binbuf_addv(b, "s", gensym("#X"));
            binbuf_addbinbuf(b, ((t_declare *)y)->x_obj.te_binbuf);
            binbuf_addv(b, ";");
        }
            /* before 0.47 we also allowed abstractions to write out to the
            parent's declarations; now we only allow non-abstraction subpatches
            to do so. */
        else if (pd_checkglist(&y->g_pd) &&
            (pd_compatibilitylevel < 47 || !canvas_isabstraction((t_canvas *)y)))
                canvas_savedeclarationsto((t_canvas *)y, b);
    }
}